

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zeDeviceGetSubDevices
          (ze_device_handle_t hDevice,uint32_t *pCount,ze_device_handle_t *phSubdevices)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  long lVar5;
  long lVar6;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar6 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,"zeDeviceGetSubDevices(hDevice, pCount, phSubdevices)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar6 + 0xf0) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar6 + 0xd38) - *(long *)(lVar6 + 0xd30) >> 3;
    lVar5 = 0;
    local_58 = *(code **)(lVar6 + 0xf0);
    do {
      if (lVar3 == lVar5) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZEHandleLifetimeValidation::zeDeviceGetSubDevicesPrologue
                               (*(ZEHandleLifetimeValidation **)(context + 0xd48),hDevice,pCount,
                                phSubdevices), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hDevice,pCount,phSubdevices);
          lVar6 = 0;
          goto LAB_001489a0;
        }
        break;
      }
      plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar5 * 8);
      result = (**(code **)(*plVar1 + 0xb0))(plVar1,hDevice,pCount,phSubdevices);
      lVar5 = lVar5 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001489d8;
  while( true ) {
    plVar1 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar6 * 8);
    result = (**(code **)(*plVar1 + 0xb8))(plVar1,hDevice,pCount,phSubdevices,zVar2);
    lVar6 = lVar6 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_001489a0:
    lVar5 = context;
    if (lVar3 == lVar6) {
      result = zVar2;
      if (((zVar2 == ZE_RESULT_SUCCESS) && (*(char *)(context + 4) == '\x01')) &&
         (phSubdevices != (ze_device_handle_t *)0x0)) {
        for (uVar4 = 0; uVar4 < *pCount; uVar4 = uVar4 + 1) {
          if (phSubdevices[uVar4] != (ze_device_handle_t)0x0) {
            HandleLifetimeValidation::addHandle
                      (*(HandleLifetimeValidation **)(lVar5 + 0xd48),phSubdevices[uVar4]);
            HandleLifetimeValidation::addDependent
                      (*(HandleLifetimeValidation **)(lVar5 + 0xd48),hDevice,phSubdevices[uVar4]);
          }
        }
      }
      break;
    }
  }
LAB_001489d8:
  logAndPropagateResult("zeDeviceGetSubDevices",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetSubDevices(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub-devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub-devices available.
                                                        ///< if count is greater than the number of sub-devices available, then the
                                                        ///< driver shall update the value with the correct number of sub-devices available.
        ze_device_handle_t* phSubdevices                ///< [in,out][optional][range(0, *pCount)] array of handle of sub-devices.
                                                        ///< if count is less than the number of sub-devices available, then driver
                                                        ///< shall only retrieve that number of sub-devices.
        )
    {
        context.logger->log_trace("zeDeviceGetSubDevices(hDevice, pCount, phSubdevices)");

        auto pfnGetSubDevices = context.zeDdiTable.Device.pfnGetSubDevices;

        if( nullptr == pfnGetSubDevices )
            return logAndPropagateResult("zeDeviceGetSubDevices", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetSubDevicesPrologue( hDevice, pCount, phSubdevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetSubDevices", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDeviceGetSubDevicesPrologue( hDevice, pCount, phSubdevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetSubDevices", result);
        }

        auto driver_result = pfnGetSubDevices( hDevice, pCount, phSubdevices );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetSubDevicesEpilogue( hDevice, pCount, phSubdevices ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetSubDevices", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phSubdevices) && (i < *pCount); ++i){
                if (phSubdevices[i]){
                    context.handleLifetime->addHandle( phSubdevices[i] );
                    context.handleLifetime->addDependent( hDevice, phSubdevices[i] );
                }
            }
        }
        return logAndPropagateResult("zeDeviceGetSubDevices", driver_result);
    }